

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceFieldOptions.hpp
# Opt level: O0

void __thiscall OpenMD::ForceFieldOptions::validateOptions(ForceFieldOptions *this)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_RDI;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffe1d8;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  *in_stack_ffffffffffffe1e0;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  *this_00;
  allocator<char> *in_stack_ffffffffffffe210;
  allocator<char> *__a;
  string *in_stack_ffffffffffffe218;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *in_stack_ffffffffffffe228;
  EqualIgnoreCaseConstraint *in_stack_ffffffffffffe230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe260;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  *in_stack_ffffffffffffe268;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffffe270;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffffe278;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffffe2d0;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffffe2d8;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffffe338;
  string local_1cc0 [103];
  allocator<char> local_1c59;
  string local_1c58 [103];
  allocator<char> local_1bf1;
  string local_1bf0 [103];
  allocator<char> local_1b89;
  string local_1b88 [864];
  string local_1828 [32];
  string local_1808 [39];
  allocator<char> local_17e1;
  string local_17e0 [103];
  undefined1 local_1779 [104];
  undefined1 local_1711 [104];
  allocator<char> local_16a9;
  string local_16a8 [871];
  allocator<char> local_1341;
  string local_1340 [103];
  allocator<char> local_12d9;
  string local_12d8 [256];
  string local_11d8 [32];
  string local_11b8 [39];
  allocator<char> local_1191;
  string local_1190 [103];
  allocator<char> local_1129;
  string local_1128 [263];
  undefined1 local_1021 [104];
  undefined1 local_fb9 [104];
  undefined1 local_f51 [513];
  string local_d50 [32];
  string local_d30 [39];
  allocator<char> local_d09;
  string local_d08 [103];
  allocator<char> local_ca1;
  string local_ca0 [103];
  allocator<char> local_c39;
  string local_c38 [519];
  allocator<char> local_a31;
  string local_a30 [103];
  allocator<char> local_9c9;
  string local_9c8 [256];
  string local_8c8 [32];
  string local_8a8 [39];
  allocator<char> local_881;
  string local_880 [103];
  allocator<char> local_819;
  string local_818 [263];
  undefined1 local_711 [104];
  undefined1 local_6a9 [104];
  allocator<char> local_641;
  string local_640 [512];
  string local_440 [32];
  string local_420 [39];
  allocator<char> local_3f9;
  string local_3f8 [103];
  allocator<char> local_391;
  string local_390 [103];
  allocator<char> local_329;
  string local_328 [519];
  allocator<char> local_121;
  string local_120 [96];
  string local_c0 [32];
  string local_a0 [55];
  allocator<char> local_69;
  string local_68 [104];
  
  bVar1 = ParameterBase::empty((ParameterBase *)((long)&in_RDI[5].description_.field_2 + 8));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,in_stack_ffffffffffffe210
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe218);
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData(in_stack_ffffffffffffe1d8);
    bVar1 = EqualIgnoreCaseConstraint::operator()
                      (in_stack_ffffffffffffe230,in_stack_ffffffffffffe228);
    std::__cxx11::string::~string(local_a0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_
                ((ParameterBase *)((long)&in_RDI[5].description_.field_2 + 8));
      uVar2 = std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,
                 in_stack_ffffffffffffe210);
      isEqualIgnoreCase(in_stack_ffffffffffffe218);
      ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                 in_stack_ffffffffffffe1d8);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar2,uVar3);
      std::__cxx11::string::~string(local_c0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator(&local_121);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)&in_RDI[8].description_._M_string_length);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,in_stack_ffffffffffffe210
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe218);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,in_stack_ffffffffffffe210
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe218);
    OpenMD::operator||(in_stack_ffffffffffffe278,in_stack_ffffffffffffe270);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,in_stack_ffffffffffffe210
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe218);
    OpenMD::operator||(in_stack_ffffffffffffe2d8,in_stack_ffffffffffffe2d0);
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData(in_stack_ffffffffffffe1d8);
    bVar1 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffffe268,in_stack_ffffffffffffe260);
    std::__cxx11::string::~string(local_420);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffffe1e0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
    std::__cxx11::string::~string(local_3f8);
    std::allocator<char>::~allocator(&local_3f9);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffffe1e0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::~allocator(&local_391);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
    std::__cxx11::string::~string(local_328);
    std::allocator<char>::~allocator(&local_329);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_
                ((ParameterBase *)&in_RDI[8].description_._M_string_length);
      uVar2 = std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,
                 in_stack_ffffffffffffe210);
      isEqualIgnoreCase(in_stack_ffffffffffffe218);
      in_stack_ffffffffffffe2d8 =
           (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
            *)local_6a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,
                 in_stack_ffffffffffffe210);
      isEqualIgnoreCase(in_stack_ffffffffffffe218);
      OpenMD::operator||(in_stack_ffffffffffffe278,in_stack_ffffffffffffe270);
      in_stack_ffffffffffffe2d0 =
           (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)local_711;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,
                 in_stack_ffffffffffffe210);
      isEqualIgnoreCase(in_stack_ffffffffffffe218);
      OpenMD::operator||(in_stack_ffffffffffffe2d8,in_stack_ffffffffffffe2d0);
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)in_stack_ffffffffffffe1d8);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar2,uVar3);
      std::__cxx11::string::~string(local_440);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffffe1e0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
      std::__cxx11::string::~string((string *)(local_711 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_711);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffffe1e0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
      std::__cxx11::string::~string((string *)(local_6a9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_6a9);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
      std::__cxx11::string::~string(local_640);
      std::allocator<char>::~allocator(&local_641);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)((long)&in_RDI[10].description_.field_2 + 8));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,in_stack_ffffffffffffe210
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe218);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,in_stack_ffffffffffffe210
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe218);
    OpenMD::operator||(in_stack_ffffffffffffe278,in_stack_ffffffffffffe270);
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData(in_stack_ffffffffffffe1d8);
    bVar1 = OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>::
            operator()((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffffe268,in_stack_ffffffffffffe260);
    std::__cxx11::string::~string(local_8a8);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffffe1e0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
    std::__cxx11::string::~string(local_880);
    std::allocator<char>::~allocator(&local_881);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
    std::__cxx11::string::~string(local_818);
    std::allocator<char>::~allocator(&local_819);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_
                ((ParameterBase *)((long)&in_RDI[10].description_.field_2 + 8));
      uVar2 = std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,
                 in_stack_ffffffffffffe210);
      isEqualIgnoreCase(in_stack_ffffffffffffe218);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,
                 in_stack_ffffffffffffe210);
      isEqualIgnoreCase(in_stack_ffffffffffffe218);
      OpenMD::operator||(in_stack_ffffffffffffe278,in_stack_ffffffffffffe270);
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)in_stack_ffffffffffffe1d8);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar2,uVar3);
      std::__cxx11::string::~string(local_8c8);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffffe1e0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
      std::__cxx11::string::~string(local_a30);
      std::allocator<char>::~allocator(&local_a31);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
      std::__cxx11::string::~string(local_9c8);
      std::allocator<char>::~allocator(&local_9c9);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)&in_RDI[0xd].description_._M_string_length);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,in_stack_ffffffffffffe210
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe218);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,in_stack_ffffffffffffe210
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe218);
    OpenMD::operator||(in_stack_ffffffffffffe278,in_stack_ffffffffffffe270);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,in_stack_ffffffffffffe210
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe218);
    OpenMD::operator||(in_stack_ffffffffffffe2d8,in_stack_ffffffffffffe2d0);
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData(in_stack_ffffffffffffe1d8);
    bVar1 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffffe268,in_stack_ffffffffffffe260);
    std::__cxx11::string::~string(local_d30);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffffe1e0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
    std::__cxx11::string::~string(local_d08);
    std::allocator<char>::~allocator(&local_d09);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffffe1e0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
    std::__cxx11::string::~string(local_ca0);
    std::allocator<char>::~allocator(&local_ca1);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
    std::__cxx11::string::~string(local_c38);
    std::allocator<char>::~allocator(&local_c39);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_
                ((ParameterBase *)&in_RDI[0xd].description_._M_string_length);
      in_stack_ffffffffffffe270 =
           (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)std::__cxx11::string::c_str()
      ;
      in_stack_ffffffffffffe278 =
           (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)local_f51;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,
                 in_stack_ffffffffffffe210);
      isEqualIgnoreCase(in_stack_ffffffffffffe218);
      in_stack_ffffffffffffe268 =
           (OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
            *)local_fb9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,
                 in_stack_ffffffffffffe210);
      isEqualIgnoreCase(in_stack_ffffffffffffe218);
      OpenMD::operator||(in_stack_ffffffffffffe278,in_stack_ffffffffffffe270);
      in_stack_ffffffffffffe260 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1021;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,
                 in_stack_ffffffffffffe210);
      isEqualIgnoreCase(in_stack_ffffffffffffe218);
      OpenMD::operator||(in_stack_ffffffffffffe2d8,in_stack_ffffffffffffe2d0);
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)in_stack_ffffffffffffe1d8);
      uVar2 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",
               in_stack_ffffffffffffe270,uVar2);
      std::__cxx11::string::~string(local_d50);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffffe1e0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
      std::__cxx11::string::~string((string *)(local_1021 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1021);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffffe1e0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
      std::__cxx11::string::~string((string *)(local_fb9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_fb9);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
      std::__cxx11::string::~string((string *)(local_f51 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_f51);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x1c));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,in_stack_ffffffffffffe210
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe218);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,in_stack_ffffffffffffe210
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe218);
    OpenMD::operator||(in_stack_ffffffffffffe278,in_stack_ffffffffffffe270);
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData(in_stack_ffffffffffffe1d8);
    bVar1 = OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>::
            operator()((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffffe268,in_stack_ffffffffffffe260);
    std::__cxx11::string::~string(local_11b8);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffffe1e0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
    std::__cxx11::string::~string(local_1190);
    std::allocator<char>::~allocator(&local_1191);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
    std::__cxx11::string::~string(local_1128);
    std::allocator<char>::~allocator(&local_1129);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x1c));
      uVar2 = std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,
                 in_stack_ffffffffffffe210);
      isEqualIgnoreCase(in_stack_ffffffffffffe218);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,
                 in_stack_ffffffffffffe210);
      isEqualIgnoreCase(in_stack_ffffffffffffe218);
      OpenMD::operator||(in_stack_ffffffffffffe278,in_stack_ffffffffffffe270);
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)in_stack_ffffffffffffe1d8);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar2,uVar3);
      std::__cxx11::string::~string(local_11d8);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffffe1e0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
      std::__cxx11::string::~string(local_1340);
      std::allocator<char>::~allocator(&local_1341);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
      std::__cxx11::string::~string(local_12d8);
      std::allocator<char>::~allocator(&local_12d9);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x30));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe220,(char *)in_stack_ffffffffffffe218,in_stack_ffffffffffffe210
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe218);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1711;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
    isEqualIgnoreCase(in_stack_ffffffffffffe218);
    OpenMD::operator||(in_stack_ffffffffffffe278,in_stack_ffffffffffffe270);
    str = (string *)local_1779;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)str,in_stack_ffffffffffffe210);
    isEqualIgnoreCase(str);
    OpenMD::operator||(in_stack_ffffffffffffe2d8,in_stack_ffffffffffffe2d0);
    __a = &local_17e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)str,__a);
    isEqualIgnoreCase(str);
    OpenMD::operator||(in_stack_ffffffffffffe338,in_RDI);
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData(in_stack_ffffffffffffe1d8);
    bVar1 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()(in_stack_ffffffffffffe268,in_stack_ffffffffffffe260);
    std::__cxx11::string::~string(local_1808);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(in_stack_ffffffffffffe1e0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
    std::__cxx11::string::~string(local_17e0);
    std::allocator<char>::~allocator(&local_17e1);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffffe1e0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
    std::__cxx11::string::~string((string *)(local_1779 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1779);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffffe1e0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
    std::__cxx11::string::~string((string *)(local_1711 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1711);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1e0);
    std::__cxx11::string::~string(local_16a8);
    std::allocator<char>::~allocator(&local_16a9);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x30));
      uVar2 = std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)str,__a);
      isEqualIgnoreCase(str);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)str,__a);
      isEqualIgnoreCase(str);
      OpenMD::operator||(in_stack_ffffffffffffe278,in_stack_ffffffffffffe270);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)str,__a);
      isEqualIgnoreCase(str);
      OpenMD::operator||(in_stack_ffffffffffffe2d8,in_stack_ffffffffffffe2d0);
      this_00 = (OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                 *)&stack0xffffffffffffe33f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)str,__a);
      isEqualIgnoreCase(str);
      OpenMD::operator||(in_stack_ffffffffffffe338,in_RDI);
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)in_stack_ffffffffffffe1d8);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar2,uVar3);
      std::__cxx11::string::~string(local_1828);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(this_00);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)this_00);
      std::__cxx11::string::~string(local_1cc0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffe33f);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)this_00);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)this_00);
      std::__cxx11::string::~string(local_1c58);
      std::allocator<char>::~allocator(&local_1c59);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)this_00);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)this_00);
      std::__cxx11::string::~string(local_1bf0);
      std::allocator<char>::~allocator(&local_1bf1);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)this_00);
      std::__cxx11::string::~string(local_1b88);
      std::allocator<char>::~allocator(&local_1b89);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void validateOptions() {
      CheckParameter(vdWtype, isEqualIgnoreCase(std::string("Lennard-Jones")));
      CheckParameter(DistanceMixingRule,
                     isEqualIgnoreCase(std::string("arithmetic")) ||
                         isEqualIgnoreCase(std::string("geometric")) ||
                         isEqualIgnoreCase(std::string("cubic")));
      CheckParameter(DistanceType, isEqualIgnoreCase(std::string("sigma")) ||
                                       isEqualIgnoreCase(std::string("Rmin")));
      CheckParameter(EnergyMixingRule,
                     isEqualIgnoreCase(std::string("arithmetic")) ||
                         isEqualIgnoreCase(std::string("geometric")) ||
                         isEqualIgnoreCase(std::string("hhg")));
      CheckParameter(TorsionAngleConvention,
                     isEqualIgnoreCase(std::string("180_is_trans")) ||
                         isEqualIgnoreCase(std::string("0_is_trans")));
      CheckParameter(EAMMixingMethod,
                     isEqualIgnoreCase(std::string("Johnson")) ||
                         isEqualIgnoreCase(std::string("Daw")) ||
                         isEqualIgnoreCase(std::string("DREAM1")) ||
                         isEqualIgnoreCase(std::string("DREAM2")));
    }